

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator=
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  ExpressionResultBuilder *in_RDI;
  ExprComponents *in_stack_ffffffffffffff68;
  ExprComponents *in_stack_ffffffffffffff70;
  ostream *poVar1;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  AssertionResultData::operator=
            ((AssertionResultData *)in_stack_ffffffffffffff70,
             (AssertionResultData *)in_stack_ffffffffffffff68);
  ExprComponents::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::__cxx11::ostringstream::str((string *)&in_RDI->m_stream);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar1 = (ostream *)&in_RDI->m_stream;
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar1,local_68);
  std::__cxx11::string::~string(local_68);
  return in_RDI;
}

Assistant:

ExpressionResultBuilder& ExpressionResultBuilder::operator=(ExpressionResultBuilder const& other ) {
        m_data = other.m_data;
        m_exprComponents = other.m_exprComponents;
        m_stream.str("");
        m_stream << other.m_stream.str();
        return *this;
    }